

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::upPrePartials
          (BeagleCPUImpl<double,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  uint uVar1;
  int *piVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  double **ppdVar6;
  _func_int **pp_Var7;
  long lVar8;
  uint uVar9;
  int *piVar10;
  uint *puVar11;
  ulong uVar12;
  double *pdVar13;
  uint uVar14;
  double *pdVar15;
  double *pdVar16;
  double *local_88;
  uint local_7c;
  ulong local_70;
  int readScalingIndex;
  double *local_60;
  double *local_58;
  double *local_50;
  long local_48;
  int *local_40;
  double *local_38;
  
  if (0 < count) {
    local_40 = &this->kPatternCount;
    puVar11 = (uint *)(operations + 8);
    uVar12 = (ulong)(uint)count;
    local_48 = (ulong)byPartition * 8 + 0x1c;
    local_7c = cumulativeScaleIndex;
    do {
      lVar5 = (long)(int)puVar11[-7];
      lVar8 = (long)(int)puVar11[-8];
      uVar14 = 0;
      readScalingIndex = puVar11[-6];
      if (byPartition) {
        uVar14 = puVar11[-1];
        local_7c = *puVar11;
      }
      local_70 = 0;
      piVar10 = local_40;
      if (byPartition) {
        piVar10 = this->gPatternPartitionsStartPatterns + (long)(int)uVar14 + 1;
        local_70 = (ulong)(uint)piVar10[-1];
      }
      ppdVar6 = this->gPartials;
      piVar2 = this->gTipStates[(int)puVar11[-3]];
      local_38 = ppdVar6[(int)puVar11[-3]];
      pdVar3 = ppdVar6[(int)puVar11[-5]];
      pdVar13 = ppdVar6[lVar8];
      pdVar15 = this->gTransitionMatrices[(int)puVar11[-4]];
      pdVar16 = this->gTransitionMatrices[(int)puVar11[-2]];
      uVar1 = *piVar10;
      if ((char)this->kFlags < '\0') {
        bVar4 = false;
        local_88 = (double *)0x0;
        this->gActiveScalingFactors[lVar8 - this->kTipCount] = 0;
      }
      else {
        uVar9 = (uint)this->kFlags;
        if ((uVar9 >> 8 & 1) == 0) {
          if ((uVar9 >> 0x19 & 1) == 0) {
            if ((int)puVar11[-7] < 0) {
              if (readScalingIndex < 0) {
                bVar4 = false;
                local_88 = (double *)0x0;
              }
              else {
                bVar4 = false;
                local_88 = this->gScaleBuffers[(uint)readScalingIndex];
              }
            }
            else {
              bVar4 = true;
              local_88 = this->gScaleBuffers[lVar5];
            }
            goto LAB_001232a5;
          }
          local_60 = pdVar15;
          local_58 = pdVar16;
          local_50 = pdVar13;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x22])
                    (this,&readScalingIndex,1,(ulong)local_7c);
          ppdVar6 = this->gScaleBuffers;
          pdVar13 = local_50;
          pdVar15 = local_60;
          pdVar16 = local_58;
        }
        else {
          ppdVar6 = this->gScaleBuffers;
          lVar5 = lVar8 - this->kTipCount;
        }
        local_88 = ppdVar6[lVar5];
        bVar4 = true;
      }
LAB_001232a5:
      pp_Var7 = (this->super_BeagleImpl)._vptr_BeagleImpl;
      if (piVar2 == (int *)0x0) {
        (*pp_Var7[0x44])(this,pdVar13,pdVar3,pdVar15,local_38,pdVar16,local_70,(ulong)uVar1);
        if (bVar4) {
          pp_Var7 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          goto LAB_0012330c;
        }
      }
      else {
        (*pp_Var7[0x45])();
        if (bVar4) {
          pp_Var7 = (this->super_BeagleImpl)._vptr_BeagleImpl;
LAB_0012330c:
          if (byPartition) {
            (*pp_Var7[0x5a])(this,pdVar13,local_88,0,0,(ulong)uVar14);
          }
          else {
            (*pp_Var7[0x59])(this,pdVar13,local_88,0,0);
          }
        }
      }
      puVar11 = (uint *)((long)puVar11 + local_48);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPrePartials(bool byPartition,
                                                     const int* operations,
                                                     int count,
                                                     int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;  // don't need to normalize/transform back preOrderPartials, off by constant rescaling factor is fine
//    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        // create a list of partial likelihood update operations
        // the order is [dest, destScaling, source1, matrix1, source2, matrix2]
        // destPartials point to the pre-order partials
        // partials1 = pre-order partials of the parent node
        // matrices1 = Ptr matrices of the current node (to the parent node)
        // partials2 = post-order partials of the sibling node
        // matrices2 = Ptr matrices of the sibling node (to the parent node)
        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int parentIndex = operations[op * numOps + 3];
        const int parentTransMatIndex = operations[op * numOps + 4];
        const int siblingIndex = operations[op * numOps + 5];
        const int siblingTransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
//            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
//                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
//            else
//                cumulativeScaleBuffer = NULL;
        }


        /// non-root nodes, can be a tip
        const REALTYPE *partials1 = gPartials[parentIndex];
        const REALTYPE *partials2 = gPartials[siblingIndex];

        const int *tipStates2 = gTipStates[siblingIndex];

        const REALTYPE *matrices1 = gTransitionMatrices[parentTransMatIndex];
        const REALTYPE *matrices2 = gTransitionMatrices[siblingTransMatIndex];


        REALTYPE *destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE *scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
//            if (siblingStates == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags &
                   BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
//            if (siblingStates == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
//            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                      << " readIndex = " << readScalingIndex << "\n";
        }

        /// destPartials point to the pre-order partials
        /// partials1 = pre-order partials of the parent node
        /// matrices1 = Ptr matrices of the current node (to the parent node)
        /// partials2 = post-order partials of the sibling node
        /// matrices2 = Ptr matrices of the sibling node (to the parent node)
        /// comment out all conditions that's not implemented

        if (tipStates2 != NULL) {
            calcPrePartialsStates(destPartials, partials1, matrices1, tipStates2, matrices2,
                                  startPattern, endPattern);

            if (rescale == 1) {// Recompute scaleFactors
                if (byPartition) {
                    rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                               currentPartition);
                } else {
                    rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                }
            }

        } else {
//            if (rescale == 2) {
//                //                    int sIndex = parIndex - kTipCount;
//                //                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
//                //                                                    &gActiveScalingFactors[sIndex]);
//                //                    if (gActiveScalingFactors[sIndex])
//                //                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);
//
//            } else if (rescale == 0) {
//                //                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
//                //                                                     matrices2,scalingFactors,startPattern,endPattern);
//            } else {

                calcPrePartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                        startPattern, endPattern);

                if (rescale == 1) {// Recompute scaleFactors
                    if (byPartition) {
                        rescalePartialsByPartition(destPartials, scalingFactors, cumulativeScaleBuffer, 0,
                                                   currentPartition);
                    } else {
                        rescalePartials(destPartials, scalingFactors, cumulativeScaleBuffer, 0);
                    }
                }
//            }
        }


//        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
//            int parScalingIndex = parIndex - kTipCount;
//            int child1ScalingIndex = parentIndex - kTipCount;
//            int child2ScalingIndex = siblingIndex - kTipCount;
//            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
//                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
//            } else if (child1ScalingIndex >= 0) {
//                int scalingIndices[1] = {child1ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            } else if (child2ScalingIndex >= 0) {
//                int scalingIndices[1] = {child2ScalingIndex};
//                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
//            }
//        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for (int i = 0; i < kPatternCount; i++)
                    fprintf(stderr, "old scaleFactor[%d] = %.5f\n", i, scalingFactors[i]);
            }
            fprintf(stderr, "Result partials:\n");
            for (int i = 0; i < kPartialsSize; i++)
                fprintf(stderr, "destP[%d] = %.5f\n", i, destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}